

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalFileFormatTarget.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::LocalFileFormatTarget::LocalFileFormatTarget
          (LocalFileFormatTarget *this,char *fileName,MemoryManager *manager)

{
  int iVar1;
  FileHandle pvVar2;
  undefined4 extraout_var;
  IOException *this_00;
  
  (this->super_XMLFormatTarget)._vptr_XMLFormatTarget =
       (_func_int **)&PTR__LocalFileFormatTarget_004133e0;
  this->fSource = (FileHandle)0x0;
  this->fDataBuf = (XMLByte *)0x0;
  this->fIndex = 0;
  this->fCapacity = 0x400;
  this->fMemoryManager = manager;
  pvVar2 = XMLPlatformUtils::openFileToWrite(fileName,manager);
  this->fSource = pvVar2;
  if (pvVar2 != (FileHandle)0x0) {
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,this->fCapacity);
    this->fDataBuf = (XMLByte *)CONCAT44(extraout_var,iVar1);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x30);
  IOException::IOException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/framework/LocalFileFormatTarget.cpp"
             ,0x3d,File_CouldNotOpenFile,fileName,(char *)0x0,(char *)0x0,(char *)0x0,
             this->fMemoryManager);
  __cxa_throw(this_00,&IOException::typeinfo,XMLException::~XMLException);
}

Assistant:

LocalFileFormatTarget::LocalFileFormatTarget( const char* const    fileName
                                            , MemoryManager* const manager)
: fSource(0)
, fDataBuf(0)
, fIndex(0)
, fCapacity(1024)
, fMemoryManager(manager)
{
    fSource = XMLPlatformUtils::openFileToWrite(fileName, manager);

    if (fSource == (FileHandle) XERCES_Invalid_File_Handle)
        ThrowXMLwithMemMgr1(IOException, XMLExcepts::File_CouldNotOpenFile, fileName, fMemoryManager);

    fDataBuf = (XMLByte*) fMemoryManager->allocate (
      fCapacity * sizeof(XMLByte));
}